

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::load_block_16_8_8(jpeg_encoder *this,int x,int c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(x * 0x30 + c);
  lVar3 = 0x33;
  do {
    lVar1 = *(long *)(this->m_comp_h_samp + lVar3);
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0x15) =
         ((uint)*(byte *)(lVar1 + 3 + lVar2) + (uint)*(byte *)(lVar1 + lVar2) >> 1) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0x11) =
         ((uint)*(byte *)(lVar1 + 9 + lVar2) + (uint)*(byte *)(lVar1 + 6 + lVar2) >> 1) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -0xd) =
         ((uint)*(byte *)(lVar1 + 0xf + lVar2) + (uint)*(byte *)(lVar1 + 0xc + lVar2) >> 1) - 0x80;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -9) =
         ((uint)*(byte *)(lVar1 + 0x15 + lVar2) + (uint)*(byte *)(lVar1 + 0x12 + lVar2) >> 1) - 0x80
    ;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -5) =
         ((uint)*(byte *)(lVar1 + 0x1b + lVar2) + (uint)*(byte *)(lVar1 + 0x18 + lVar2) >> 1) - 0x80
    ;
    *(uint *)(this->m_comp_h_samp + lVar3 * 4 + -1) =
         ((uint)*(byte *)(lVar1 + 0x21 + lVar2) + (uint)*(byte *)(lVar1 + 0x1e + lVar2) >> 1) - 0x80
    ;
    *(uint *)(this->m_comp_v_samp + lVar3 * 4) =
         ((uint)*(byte *)(lVar1 + 0x27 + lVar2) + (uint)*(byte *)(lVar1 + 0x24 + lVar2) >> 1) - 0x80
    ;
    *(uint *)(this->m_comp_v_samp + lVar3 * 4 + 4) =
         ((uint)*(byte *)(lVar1 + 0x2d + lVar2) + (uint)*(byte *)(lVar1 + 0x2a + lVar2) >> 1) - 0x80
    ;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x73);
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8_8(int x, int c)
{
  uint8 *pSrc1;
  sample_array_t *pDst = m_sample_array;
  x = (x * (16 * 3)) + c;
  for (int i = 0; i < 8; i++, pDst += 8)
  {
    pSrc1 = m_mcu_lines[i + 0] + x;
    pDst[0] = ((pSrc1[ 0 * 3] + pSrc1[ 1 * 3]) >> 1) - 128; pDst[1] = ((pSrc1[ 2 * 3] + pSrc1[ 3 * 3]) >> 1) - 128;
    pDst[2] = ((pSrc1[ 4 * 3] + pSrc1[ 5 * 3]) >> 1) - 128; pDst[3] = ((pSrc1[ 6 * 3] + pSrc1[ 7 * 3]) >> 1) - 128;
    pDst[4] = ((pSrc1[ 8 * 3] + pSrc1[ 9 * 3]) >> 1) - 128; pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3]) >> 1) - 128;
    pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3]) >> 1) - 128; pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3]) >> 1) - 128;
  }
}